

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O2

void __thiscall
CoreML::LinearModel::LinearModel(LinearModel *this,string *predictedValueOutput,string *description)

{
  ulong uVar1;
  ModelDescription *pMVar2;
  undefined8 *puVar3;
  
  Model::Model(&this->super_Model,description);
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__Model_004051e0;
  pMVar2 = Specification::Model::_internal_mutable_description
                     ((this->super_Model).m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  uVar1 = (pMVar2->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar2->predictedfeaturename_,predictedValueOutput,puVar3);
  return;
}

Assistant:

LinearModel::LinearModel(const std::string& predictedValueOutput,
                             const std::string& description)
    : Model(description) {
        m_spec->mutable_description()->set_predictedfeaturename(predictedValueOutput);
    }